

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.c
# Opt level: O2

int64_t time_util_hhmmss_ss_to_utime(double time)

{
  double dVar1;
  
  dVar1 = fmod(time,100.0);
  return ((ulong)(((int)time / 10000 & 0xffU) * 360000) + (long)(dVar1 * 100.0 + 0.0) +
         (ulong)((ushort)((short)((long)(int)time % 10000) / 100) & 0xff) * 6000) * 10000;
}

Assistant:

int64_t time_util_hhmmss_ss_to_utime(double time)
{
    int64_t utime = 0;

    int itime = ((int) time);

    double seconds = fmod(time, 100.0);
    uint8_t minutes = (itime % 10000) / 100;
    uint8_t hours =  itime / 10000;

    utime += seconds *   100;
    utime += minutes *  6000;
    utime += hours   *360000;

    utime *= 10000;

    return utime;
}